

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O1

void soul::sanityCheckBuildSettings
               (BuildSettings *settings,uint32_t minBlockSize,uint32_t maxBlockSize)

{
  CodeLocation local_c8;
  CompileMessage local_b0;
  CompileMessage local_78;
  CompileMessage local_40;
  
  if (0x10000 < settings->maxBlockSize) {
    local_c8.sourceCode.object = (SourceCodeText *)0x0;
    local_c8.location.data = (char *)0x0;
    CompileMessageHelpers::createMessage<>(&local_40,limitExceeded,error,"Unsupported block size");
    CodeLocation::throwError(&local_c8,&local_40);
  }
  if ((0.0 < settings->sampleRate) && (settings->sampleRate <= 4800000.0)) {
    if (0xfffffffa < settings->optimisationLevel - 4U) {
      return;
    }
    local_c8.sourceCode.object = (SourceCodeText *)0x0;
    local_c8.location.data = (char *)0x0;
    CompileMessageHelpers::createMessage<>
              (&local_b0,limitExceeded,error,"Unsupported optimisation level");
    CodeLocation::throwError(&local_c8,&local_b0);
  }
  local_c8.sourceCode.object = (SourceCodeText *)0x0;
  local_c8.location.data = (char *)0x0;
  CompileMessageHelpers::createMessage<>(&local_78,limitExceeded,error,"Unsupported sample rate");
  CodeLocation::throwError(&local_c8,&local_78);
}

Assistant:

static void sanityCheckBuildSettings (const BuildSettings& settings,
                                      uint32_t minBlockSize = 1, uint32_t maxBlockSize = 65536)
{
    if (settings.maxBlockSize != 0 && (settings.maxBlockSize < minBlockSize || settings.maxBlockSize > maxBlockSize))
        CodeLocation().throwError (Errors::unsupportedBlockSize());

    constexpr double maxSampleRate = 48000.0 * 100;

    if (settings.sampleRate <= 0 || settings.sampleRate > maxSampleRate)
        CodeLocation().throwError (Errors::unsupportedSampleRate());

    if (settings.optimisationLevel < -1 || settings.optimisationLevel > 3)
        CodeLocation().throwError (Errors::unsupportedOptimisationLevel());
}